

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

void __thiscall p2t::Edge::Edge(Edge *this,Point *p1,Point *p2)

{
  runtime_error *this_00;
  Edge *local_60;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40 [32];
  Point *local_20;
  Point *p2_local;
  Point *p1_local;
  Edge *this_local;
  
  this->p = p1;
  this->q = p2;
  local_20 = p2;
  p2_local = p1;
  p1_local = (Point *)this;
  if (p1->y < p2->y || p1->y == p2->y) {
    if ((p1->y == p2->y) && (!NAN(p1->y) && !NAN(p2->y))) {
      if (p1->x < p2->x || p1->x == p2->x) {
        if ((p1->x == p2->x) && (!NAN(p1->x) && !NAN(p2->x))) {
          local_55 = 1;
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_40,"repeat points",&local_41);
          std::runtime_error::runtime_error(this_00,local_40);
          local_55 = 0;
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        this->q = p1;
        this->p = p2;
      }
    }
  }
  else {
    this->q = p1;
    this->p = p2;
  }
  local_60 = this;
  std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::push_back(&this->q->edge_list,&local_60);
  return;
}

Assistant:

Edge(Point& p1, Point& p2) : p(&p1), q(&p2)
  {
    if (p1.y > p2.y) {
      q = &p1;
      p = &p2;
    } else if (p1.y == p2.y) {
      if (p1.x > p2.x) {
        q = &p1;
        p = &p2;
      } else if (p1.x == p2.x) {
        // Repeat points
        // ASSIMP_CHANGE (aramis_acg)
        throw std::runtime_error(std::string("repeat points"));
        //assert(false);
      }
    }

    q->edge_list.push_back(this);
  }